

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

void Abc_ExactStats(void)

{
  int level;
  long lVar1;
  double dVar2;
  double dVar3;
  
  if (s_pSesStore != (Ses_Store_t *)0x0) {
    puts(
        "-------------------------------------------------------------------------------------------------------------------------------"
        );
    puts(
        "                                    0         1         2         3         4         5         6         7         8     total"
        );
    puts(
        "-------------------------------------------------------------------------------------------------------------------------------"
        );
    printf("number of considered cuts :");
    lVar1 = 0;
    do {
      printf("%10lu",s_pSesStore->pCutCount[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
    printf("%10lu\n",s_pSesStore->nCutCount);
    printf(" - trivial                :");
    lVar1 = 0;
    do {
      printf("%10lu",s_pSesStore->pSynthesizedTrivial[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
    printf("%10lu\n",s_pSesStore->nSynthesizedTrivial);
    printf(" - synth (imp)            :");
    lVar1 = 0;
    do {
      printf("%10lu",s_pSesStore->pSynthesizedImp[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
    printf("%10lu\n",s_pSesStore->nSynthesizedImp);
    printf(" - synth (res)            :");
    lVar1 = 0;
    do {
      printf("%10lu",s_pSesStore->pSynthesizedRL[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
    printf("%10lu\n",s_pSesStore->nSynthesizedRL);
    printf(" - not synth (imp)        :");
    lVar1 = 0;
    do {
      printf("%10lu",s_pSesStore->pUnsynthesizedImp[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
    printf("%10lu\n",s_pSesStore->nUnsynthesizedImp);
    printf(" - not synth (res)        :");
    lVar1 = 0;
    do {
      printf("%10lu",s_pSesStore->pUnsynthesizedRL[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
    printf("%10lu\n",s_pSesStore->nUnsynthesizedRL);
    printf(" - cache hits             :");
    lVar1 = 0;
    do {
      printf("%10lu",s_pSesStore->pCacheHits[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
    printf("%10lu\n",s_pSesStore->nCacheHits);
    puts(
        "-------------------------------------------------------------------------------------------------------------------------------"
        );
    printf("number of entries         : %d\n",(ulong)(uint)s_pSesStore->nEntriesCount);
    printf("number of valid entries   : %d\n",(ulong)(uint)s_pSesStore->nValidEntriesCount);
    printf("number of invalid entries : %d\n",
           (ulong)(uint)(s_pSesStore->nEntriesCount - s_pSesStore->nValidEntriesCount));
    puts(
        "-------------------------------------------------------------------------------------------------------------------------------"
        );
    printf("number of SAT calls       : %lu\n",s_pSesStore->nSatCalls);
    printf("number of UNSAT calls     : %lu\n",s_pSesStore->nUnsatCalls);
    printf("number of UNDEF calls     : %lu\n",s_pSesStore->nUndefCalls);
    puts(
        "-------------------------------------------------------------------------------------------------------------------------------"
        );
    level = 0x98b430;
    puts("Runtime breakdown:");
    Abc_Print(level,"%s =","Exact    ");
    dVar2 = 0.0;
    if (s_pSesStore->timeTotal != 0) {
      dVar2 = ((double)s_pSesStore->timeExact * 100.0) / (double)s_pSesStore->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)s_pSesStore->timeExact / 1000000.0,dVar2);
    Abc_Print(level,"%s ="," Sat     ");
    dVar2 = 0.0;
    if (s_pSesStore->timeTotal != 0) {
      dVar2 = ((double)s_pSesStore->timeSat * 100.0) / (double)s_pSesStore->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)s_pSesStore->timeSat / 1000000.0,dVar2);
    Abc_Print(level,"%s =","  Sat    ");
    dVar2 = 0.0;
    if (s_pSesStore->timeTotal != 0) {
      dVar2 = ((double)s_pSesStore->timeSatSat * 100.0) / (double)s_pSesStore->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)s_pSesStore->timeSatSat / 1000000.0,dVar2);
    Abc_Print(level,"%s =","  Unsat  ");
    dVar2 = 0.0;
    if (s_pSesStore->timeTotal != 0) {
      dVar2 = ((double)s_pSesStore->timeSatUnsat * 100.0) / (double)s_pSesStore->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)s_pSesStore->timeSatUnsat / 1000000.0,dVar2);
    Abc_Print(level,"%s =","  Undef  ");
    dVar2 = 0.0;
    if (s_pSesStore->timeTotal != 0) {
      dVar2 = ((double)s_pSesStore->timeSatUndef * 100.0) / (double)s_pSesStore->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)s_pSesStore->timeSatUndef / 1000000.0,dVar2);
    Abc_Print(level,"%s ="," Instance");
    dVar2 = 0.0;
    if (s_pSesStore->timeTotal != 0) {
      dVar2 = ((double)s_pSesStore->timeInstance * 100.0) / (double)s_pSesStore->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)s_pSesStore->timeInstance / 1000000.0,dVar2);
    Abc_Print(level,"%s =","Other    ");
    lVar1 = s_pSesStore->timeTotal;
    dVar3 = (double)(lVar1 - s_pSesStore->timeExact);
    dVar2 = 0.0;
    if (lVar1 != 0) {
      dVar2 = (dVar3 * 100.0) / (double)lVar1;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar3 / 1000000.0,dVar2);
    Abc_Print(level,"%s =","ALL      ");
    dVar2 = (double)s_pSesStore->timeTotal;
    dVar3 = 0.0;
    if (s_pSesStore->timeTotal != 0) {
      dVar3 = (dVar2 * 100.0) / dVar2;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar2 / 1000000.0,dVar3);
    return;
  }
  puts("BMS manager has not been started");
  return;
}

Assistant:

void Abc_ExactStats()
{
    int i;

    if ( !s_pSesStore )
    {
        printf( "BMS manager has not been started\n" );
        return;
    }

    printf( "-------------------------------------------------------------------------------------------------------------------------------\n" );
    printf( "                                    0         1         2         3         4         5         6         7         8     total\n" );
    printf( "-------------------------------------------------------------------------------------------------------------------------------\n" );
    printf( "number of considered cuts :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pCutCount[i] );
    printf( "%10lu\n", s_pSesStore->nCutCount );
    printf( " - trivial                :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pSynthesizedTrivial[i] );
    printf( "%10lu\n", s_pSesStore->nSynthesizedTrivial );
    printf( " - synth (imp)            :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pSynthesizedImp[i] );
    printf( "%10lu\n", s_pSesStore->nSynthesizedImp );
    printf( " - synth (res)            :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pSynthesizedRL[i] );
    printf( "%10lu\n", s_pSesStore->nSynthesizedRL );
    printf( " - not synth (imp)        :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pUnsynthesizedImp[i] );
    printf( "%10lu\n", s_pSesStore->nUnsynthesizedImp );
    printf( " - not synth (res)        :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pUnsynthesizedRL[i] );
    printf( "%10lu\n", s_pSesStore->nUnsynthesizedRL );
    printf( " - cache hits             :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pCacheHits[i] );
    printf( "%10lu\n", s_pSesStore->nCacheHits );
    printf( "-------------------------------------------------------------------------------------------------------------------------------\n" );
    printf( "number of entries         : %d\n", s_pSesStore->nEntriesCount );
    printf( "number of valid entries   : %d\n", s_pSesStore->nValidEntriesCount );
    printf( "number of invalid entries : %d\n", s_pSesStore->nEntriesCount - s_pSesStore->nValidEntriesCount );
    printf( "-------------------------------------------------------------------------------------------------------------------------------\n" );
    printf( "number of SAT calls       : %lu\n", s_pSesStore->nSatCalls );
    printf( "number of UNSAT calls     : %lu\n", s_pSesStore->nUnsatCalls );
    printf( "number of UNDEF calls     : %lu\n", s_pSesStore->nUndefCalls );

    printf( "-------------------------------------------------------------------------------------------------------------------------------\n" );
    printf( "Runtime breakdown:\n" );
    ABC_PRTP( "Exact    ", s_pSesStore->timeExact,                          s_pSesStore->timeTotal );
    ABC_PRTP( " Sat     ", s_pSesStore->timeSat,                            s_pSesStore->timeTotal );
    ABC_PRTP( "  Sat    ", s_pSesStore->timeSatSat,                         s_pSesStore->timeTotal );
    ABC_PRTP( "  Unsat  ", s_pSesStore->timeSatUnsat,                       s_pSesStore->timeTotal );
    ABC_PRTP( "  Undef  ", s_pSesStore->timeSatUndef,                       s_pSesStore->timeTotal );
    ABC_PRTP( " Instance", s_pSesStore->timeInstance,                       s_pSesStore->timeTotal );
    ABC_PRTP( "Other    ", s_pSesStore->timeTotal - s_pSesStore->timeExact, s_pSesStore->timeTotal );
    ABC_PRTP( "ALL      ", s_pSesStore->timeTotal,                          s_pSesStore->timeTotal );
}